

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::setStartId(QWizard *this,int theid)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  int newStart;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  newStart = theid;
  if (theid == -1) {
    lVar2 = *(long *)(lVar1 + 0x2e0);
    newStart = -1;
    if ((lVar2 != 0) && (*(long *)(lVar2 + 0x30) != 0)) {
      newStart = *(int *)(*(long *)(lVar2 + 0x20) + 0x20);
    }
  }
  if (*(int *)(lVar1 + 0x338) != newStart) {
    bVar3 = QMap<int,_QWizardPage_*>::contains
                      ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),&newStart);
    if (!bVar3) {
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_28 = "default";
      QMessageLogger::warning
                (local_40,"QWizard::setStartId: Invalid page ID %d",(ulong)(uint)newStart);
      goto LAB_004c4191;
    }
    *(int *)(lVar1 + 0x338) = newStart;
  }
  *(bool *)(lVar1 + 0x33c) = theid != -1;
LAB_004c4191:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setStartId(int theid)
{
    Q_D(QWizard);
    int newStart = theid;
    if (theid == -1)
        newStart = d->pageMap.size() ? d->pageMap.constBegin().key() : -1;

    if (d->start == newStart) {
        d->startSetByUser = theid != -1;
        return;
    }

    if (Q_UNLIKELY(!d->pageMap.contains(newStart))) {
        qWarning("QWizard::setStartId: Invalid page ID %d", newStart);
        return;
    }
    d->start = newStart;
    d->startSetByUser = theid != -1;
}